

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void inverse_transform_block_facade
               (MACROBLOCK *x,int plane,int block,int blk_row,int blk_col,int eob,int reduced_tx_set
               )

{
  PLANE_TYPE PVar1;
  TX_SIZE TVar2;
  TX_TYPE TVar3;
  int eob_00;
  long lVar4;
  tran_low_t *dqcoeff_00;
  int in_ECX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint8_t *dst;
  int dst_stride;
  macroblockd_plane *pd;
  TX_TYPE tx_type;
  TX_SIZE tx_size;
  PLANE_TYPE plane_type;
  tran_low_t *dqcoeff;
  MACROBLOCKD *xd;
  macroblock_plane *p;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  PLANE_TYPE plane_type_00;
  MACROBLOCKD *in_stack_ffffffffffffffb8;
  undefined5 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffe0;
  
  plane_type_00 = (PLANE_TYPE)((uint)in_stack_ffffffffffffffb4 >> 0x18);
  if (in_R9D != 0) {
    eob_00 = (int)in_RDI + in_ESI * 0x88;
    lVar4 = in_RDI + 0x1a0;
    PVar1 = get_plane_type(in_ESI);
    TVar2 = av1_get_tx_size(in_stack_ffffffffffffffa0,
                            (MACROBLOCKD *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    TVar3 = av1_get_tx_type(in_stack_ffffffffffffffb8,plane_type_00,in_stack_ffffffffffffffb0,
                            (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                            (TX_SIZE)((ulong)in_stack_ffffffffffffffa8 >> 0x18),
                            in_stack_ffffffffffffffa4);
    dqcoeff_00 = (tran_low_t *)(lVar4 + 0x10 + (long)in_ESI * 0xa30);
    av1_inverse_transform_block
              ((MACROBLOCKD *)
               CONCAT17(PVar1,CONCAT16(TVar2,CONCAT15(TVar3,in_stack_ffffffffffffffc0))),dqcoeff_00,
               dqcoeff_00[10],(TX_TYPE)((uint)in_stack_ffffffffffffffb0 >> 0x18),
               (TX_SIZE)((uint)in_stack_ffffffffffffffb0 >> 0x10),
               (uint8_t *)
               (*(long *)(dqcoeff_00 + 4) + (long)((in_ECX * dqcoeff_00[10] + in_R8D) * 4)),
               (int)lVar4,eob_00,in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

static inline void inverse_transform_block_facade(MACROBLOCK *const x,
                                                  int plane, int block,
                                                  int blk_row, int blk_col,
                                                  int eob, int reduced_tx_set) {
  if (!eob) return;
  struct macroblock_plane *const p = &x->plane[plane];
  MACROBLOCKD *const xd = &x->e_mbd;
  tran_low_t *dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const TX_SIZE tx_size = av1_get_tx_size(plane, xd);
  const TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, blk_row, blk_col,
                                          tx_size, reduced_tx_set);

  struct macroblockd_plane *const pd = &xd->plane[plane];
  const int dst_stride = pd->dst.stride;
  uint8_t *dst = &pd->dst.buf[(blk_row * dst_stride + blk_col) << MI_SIZE_LOG2];
  av1_inverse_transform_block(xd, dqcoeff, plane, tx_type, tx_size, dst,
                              dst_stride, eob, reduced_tx_set);
}